

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O3

void cmd_util::dumpEntryInfo(ExeElementWrapper *w)

{
  undefined1 uVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char16_t *pcVar6;
  long lVar7;
  long lVar8;
  QString translated;
  WrappedValue value;
  QString str;
  QString local_b8;
  undefined1 local_a0 [32];
  WrappedValue local_80;
  long local_58;
  long local_50;
  QString local_48;
  
  if (w != (ExeElementWrapper *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n------\n",8);
    iVar3 = (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xf])(w);
    local_58 = CONCAT44(extraout_var,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(&local_b8,w);
    QString::toUtf8_helper((QString *)local_a0);
    pcVar6 = (char16_t *)local_a0._8_8_;
    if ((char16_t *)local_a0._8_8_ == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QByteArray::_empty;
    }
    local_80._vptr_WrappedValue = (_func_int **)&local_80.m_Owner;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,pcVar6,local_a0._16_8_ + (long)pcVar6);
    if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_a0._0_8_,1,8);
      }
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_80._vptr_WrappedValue,local_80._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"size: 0x",8);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xd])(w);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fieldsCount: ",0xd);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((AbstractByteBuffer **)local_80._vptr_WrappedValue != &local_80.m_Owner) {
      operator_delete(local_80._vptr_WrappedValue,
                      (ulong)((long)&(local_80.m_Owner)->_vptr_AbstractByteBuffer + 1));
    }
    piVar2 = (int *)CONCAT71(local_b8.d.d._1_7_,local_b8.d.d._0_1_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_b8.d.d._1_7_,local_b8.d.d._0_1_),2,8);
      }
    }
    if (local_58 != 0) {
      lVar7 = 0;
      do {
        iVar3 = (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x14])
                          (w,lVar7,0xffffffffffffffff);
        if (CONCAT44(extraout_var_00,iVar3) != -1) {
          lVar8 = *(long *)(std::cout + -0x18);
          if ((&DAT_00159249)[lVar8] == '\0') {
            std::ios::widen((char)lVar8 + 'h');
            (&DAT_00159249)[lVar8] = 1;
          }
          QVariant::toString[lVar8] = (code)0x30;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
          lVar8 = std::cout;
          *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
          *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(lVar8 + -0x18)) = 8;
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x17])(&local_b8,w,lVar7);
          QString::toUtf8_helper((QString *)local_a0);
          pcVar6 = (char16_t *)local_a0._8_8_;
          if ((char16_t *)local_a0._8_8_ == (char16_t *)0x0) {
            pcVar6 = (char16_t *)&QByteArray::_empty;
          }
          local_80._vptr_WrappedValue = (_func_int **)&local_80.m_Owner;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pcVar6,local_a0._16_8_ + (long)pcVar6);
          if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a0._0_8_,1,8);
            }
          }
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_80._vptr_WrappedValue,
                              local_80._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          if ((AbstractByteBuffer **)local_80._vptr_WrappedValue != &local_80.m_Owner) {
            operator_delete(local_80._vptr_WrappedValue,
                            (ulong)((long)&(local_80.m_Owner)->_vptr_AbstractByteBuffer + 1));
          }
          piVar2 = (int *)CONCAT71(local_b8.d.d._1_7_,local_b8.d.d._0_1_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT71(local_b8.d.d._1_7_,local_b8.d.d._0_1_),2,8);
            }
          }
          iVar3 = (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x10])(w);
          local_50 = CONCAT44(extraout_var_01,iVar3) + (ulong)(CONCAT44(extraout_var_01,iVar3) == 0)
          ;
          lVar8 = 0;
          do {
            (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])(&local_80,w,lVar7,lVar8)
            ;
            if (local_80.m_Size == 0) break;
            WrappedValue::toQString(&local_48,&local_80);
            uVar4 = (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x1a])(w,lVar7,lVar8);
            uVar1 = (char)(0x5676725f >> ((char)uVar4 * '\b' & 0x1fU));
            if (3 < uVar4) {
              uVar1 = 0x5f;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
            QString::toUtf8_helper(&local_b8);
            pcVar6 = local_b8.d.ptr;
            if (local_b8.d.ptr == (char16_t *)0x0) {
              pcVar6 = (char16_t *)&QByteArray::_empty;
            }
            local_a0._0_8_ = local_a0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a0,pcVar6,local_b8.d.size + (long)pcVar6);
            piVar2 = (int *)CONCAT71(local_b8.d.d._1_7_,local_b8.d.d._0_1_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT71(local_b8.d.d._1_7_,local_b8.d.d._0_1_),1,8);
              }
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_a0._0_8_,local_a0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            local_b8.d.d._0_1_ = uVar1;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_b8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
            if ((QArrayData *)local_a0._0_8_ != (QArrayData *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
            if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
              }
            }
            lVar8 = lVar8 + 1;
          } while (local_50 != lVar8);
          (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])(&local_b8,w,lVar7);
          if (0 < local_b8.d.size) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            QString::toUtf8_helper((QString *)local_a0);
            pcVar6 = (char16_t *)local_a0._8_8_;
            if ((char16_t *)local_a0._8_8_ == (char16_t *)0x0) {
              pcVar6 = (char16_t *)&QByteArray::_empty;
            }
            local_80._vptr_WrappedValue = (_func_int **)&local_80.m_Owner;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,pcVar6,local_a0._16_8_ + (long)pcVar6);
            if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_a0._0_8_,1,8);
              }
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_80._vptr_WrappedValue,
                                local_80._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            if ((AbstractByteBuffer **)local_80._vptr_WrappedValue != &local_80.m_Owner) {
              operator_delete(local_80._vptr_WrappedValue,
                              (ulong)((long)&(local_80.m_Owner)->_vptr_AbstractByteBuffer + 1));
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          piVar2 = (int *)CONCAT71(local_b8.d.d._1_7_,local_b8.d.d._0_1_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT71(local_b8.d.d._1_7_,local_b8.d.d._0_1_),2,8);
            }
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != local_58);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
  }
  return;
}

Assistant:

void cmd_util::dumpEntryInfo(ExeElementWrapper *w)
{
    if (w == NULL) return;
    
    std::cout << "\n------\n";
    size_t fields = w->getFieldsCount();
    
    std::cout << "[" << w->getName().toStdString() << "] "
        << "size: 0x" << std::hex << w->getSize()
        << " " 
        << "fieldsCount: " << std::dec << fields << "\n" 
        << std::endl;

    for (size_t i = 0; i < fields; i++) {
        offset_t offset = w->getFieldOffset(i);
        if (offset == INVALID_ADDR) {
            continue;
        }
        OUT_PADDED_OFFSET(std::cout, offset);
        std::cout << " " << w->getFieldName(i).toStdString() << "\t";

        size_t subfields = w->getSubFieldsCount();
        if (subfields == 0) subfields = 1; //it may not have a sublist, but a single value
        
        for (size_t y = 0; y < subfields; y++) {
            WrappedValue value = w->getWrappedValue(i, y);
            if (!value.isValid()) break;
            
            QString str = value.toQString();

            Executable::addr_type aType = w->containsAddrType(i, y);
            char c = addrTypeToChar(aType);
            std::cout << "[" << str.toStdString() << " " << c << "]";
        }

        QString translated = w->translateFieldContent(i);
        if (translated.size() > 0) {
            std::cout << " " << translated.toStdString() << " ";
        }
        std::cout << "\n";
    }
    std::cout << "------" << std::endl;
}